

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O2

void __thiscall Window::_q_filesFound(Window *this)

{
  long lVar1;
  QString *pQVar2;
  WindowPrivate *pWVar3;
  QList<QString> **in_R9;
  QString path;
  QArrayDataPointer<QString> local_b0;
  QArrayDataPointer<QString> local_98;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<char16_t> local_48;
  undefined1 local_30 [24];
  
  pWVar3 = (this->d).d;
  lVar1 = (pWVar3->imageFiles).d.size;
  QFuture<QList<QString>>::result<QList<QString>,void>
            ((QList<QString> *)&local_b0,&pWVar3->fileFuture);
  QList<QString>::append(&((this->d).d)->imageFiles,(QList<QString> *)&local_b0);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_b0);
  if (lVar1 == 0) {
    WindowPrivate::loadImages((this->d).d);
  }
  pWVar3 = (this->d).d;
  if ((pWVar3->imageLocations).d.size != 0) {
    pQVar2 = (pWVar3->imageLocations).d.ptr;
    local_b0.d = (Data *)(pQVar2->d).d;
    local_b0.ptr = (QString *)(pQVar2->d).ptr;
    local_b0.size = (pQVar2->d).size;
    if (local_b0.d != (Data *)0x0) {
      LOCK();
      (((Data *)local_b0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (((Data *)local_b0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      pWVar3 = (this->d).d;
    }
    QList<QString>::removeFirst(&pWVar3->imageLocations);
    local_98.d = (Data *)0x0;
    local_98.ptr = (QString *)0x0;
    local_98.size = 0;
    QString::QString((QString *)&local_48,"*.jpg");
    QList<QString>::emplaceBack<QString>((QList<QString> *)&local_98,(QString *)&local_48);
    QString::QString((QString *)&local_60,"*.jpeg");
    QList<QString>::emplaceBack<QString>((QList<QString> *)&local_98,(QString *)&local_60);
    QString::QString((QString *)&local_78,"*.png");
    QList<QString>::emplaceBack<QString>((QList<QString> *)&local_98,(QString *)&local_78);
    local_30._0_8_ = &((this->d).d)->imageLocations;
    QtConcurrent::
    run<QList<QString>(&)(QString_const&,QList<QString>const&,QList<QString>*),QString_const&,QList<QString>&,QList<QString>*>
              ((QFuture<QList<QString>_> *)(local_30 + 8),(QtConcurrent *)findFiles,
               (_func_QList<QString>_QString_ptr_QList<QString>_ptr_QList<QString>_ptr *)&local_b0,
               (QString *)&local_98,(QList<QString> *)local_30,in_R9);
    QFutureInterface<QList<QString>_>::operator=
              (&(((this->d).d)->fileFuture).d,(QFutureInterface<QList<QString>_> *)(local_30 + 8));
    QFutureInterface<QList<QString>_>::~QFutureInterface
              ((QFutureInterface<QList<QString>_> *)(local_30 + 8));
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_98);
    pWVar3 = (this->d).d;
    QFutureWatcher<QList<QString>_>::setFuture(pWVar3->filesFutureWatcher,&pWVar3->fileFuture);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
  }
  return;
}

Assistant:

void
Window::_q_filesFound()
{
	const bool start = d->imageFiles.isEmpty();

	d->imageFiles += d->fileFuture.result();

	if( start )
		d->loadImages();

	if( !d->imageLocations.isEmpty() )
	{
		const QString path = d->imageLocations.at( 0 );
		d->imageLocations.removeFirst();

		d->fileFuture = QtConcurrent::run(
			findFiles, path,
			QStringList() << "*.jpg" << "*.jpeg" << "*.png",
			&d->imageLocations );

		d->filesFutureWatcher->setFuture( d->fileFuture );
	}
}